

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  void *__src;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  iVar1 = GetPixelDataSize(1,1,image.format);
  local_48 = rec.width;
  fStack_44 = rec.height;
  uVar7 = (uint)fStack_44;
  __return_storage_ptr__->width = (int)local_48;
  __return_storage_ptr__->height = uVar7;
  iVar3 = (int)local_48 * iVar1;
  pvVar2 = calloc((long)(int)(iVar3 * uVar7),1);
  __return_storage_ptr__->data = pvVar2;
  local_58 = rec.x;
  fStack_54 = rec.y;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  uVar4 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = uVar4;
  }
  uVar5 = (ulong)uVar7;
  __src = (void *)(((long)(int)fStack_54 * (long)image.width + (long)(int)local_58) * (long)iVar1 +
                  (long)image.data);
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    memcpy((void *)((long)pvVar2 + (long)(int)uVar4),__src,(long)iVar3);
    uVar4 = uVar4 + iVar3;
    __src = (void *)((long)__src + (long)iVar1 * (long)image.width);
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)rec.width*(int)rec.height*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < (int)rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}